

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetupDrawChannels(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  char cVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiTableDrawChannelIdx IVar6;
  int column_n;
  long lVar7;
  ImGuiTableDrawChannelIdx IVar8;
  int iVar9;
  long lVar10;
  ImGuiTableDrawChannelIdx IVar11;
  int iVar12;
  bool bVar13;
  
  iVar12 = 1;
  if ((table->Flags & 0x100000) == 0) {
    iVar12 = (int)table->ColumnsEnabledCount;
  }
  bVar13 = true;
  if (table->ColumnsCount <= (int)table->ColumnsEnabledCount) {
    bVar13 = table->VisibleMaskByIndex != table->EnabledMaskByIndex;
  }
  iVar9 = ('\0' < table->FreezeRowsCount | 2) + (uint)bVar13 +
          (iVar12 << ('\0' < table->FreezeRowsCount));
  ImDrawListSplitter::Split(&table->DrawSplitter,table->InnerWindow->DrawList,iVar9);
  IVar6 = 0xff;
  if (bVar13 != false) {
    IVar6 = (char)iVar9 + 0xff;
  }
  table->DummyDrawChannel = IVar6;
  table->Bg2DrawChannelCurrent = '\x01';
  IVar8 = (char)iVar12 + '\x02';
  lVar7 = 0;
  if (table->FreezeRowsCount < '\x01') {
    IVar8 = '\x01';
  }
  table->Bg2DrawChannelUnfrozen = IVar8;
  iVar9 = table->ColumnsCount;
  cVar2 = (char)iVar12 + '\x01';
  if (table->FreezeRowsCount < '\x01') {
    cVar2 = '\0';
  }
  IVar8 = '\x02';
  lVar10 = 0x57;
  for (; lVar7 < iVar9; lVar7 = lVar7 + 1) {
    pIVar1 = (table->Columns).Data;
    if ((*(char *)((long)&pIVar1->WidthGiven + lVar10 + 1) == '\x01') &&
       (*(char *)((long)&pIVar1->WidthGiven + lVar10 + 2) == '\x01')) {
      *(ImGuiTableDrawChannelIdx *)((long)&pIVar1->Flags + lVar10 + 1) = IVar8;
      *(ImGuiTableDrawChannelIdx *)((long)&pIVar1->Flags + lVar10 + 2) = IVar8 + cVar2;
      IVar11 = IVar8;
      IVar8 = IVar8 + ((table->Flags & 0x100000) == 0);
    }
    else {
      *(ImGuiTableDrawChannelIdx *)((long)&pIVar1->Flags + lVar10 + 2) = IVar6;
      *(ImGuiTableDrawChannelIdx *)((long)&pIVar1->Flags + lVar10 + 1) = IVar6;
      IVar11 = IVar6;
    }
    *(ImGuiTableDrawChannelIdx *)((long)&pIVar1->Flags + lVar10) = IVar11;
    lVar10 = lVar10 + 0x68;
  }
  IVar3 = (table->InnerClipRect).Max;
  IVar4 = (table->HostClipRect).Min;
  IVar5 = (table->HostClipRect).Max;
  (table->BgClipRect).Min = (table->InnerClipRect).Min;
  (table->BgClipRect).Max = IVar3;
  IVar3 = (table->OuterWindow->ClipRect).Max;
  (table->Bg0ClipRectForDrawCmd).Min = (table->OuterWindow->ClipRect).Min;
  (table->Bg0ClipRectForDrawCmd).Max = IVar3;
  (table->Bg2ClipRectForDrawCmd).Min = IVar4;
  (table->Bg2ClipRectForDrawCmd).Max = IVar5;
  return;
}

Assistant:

void ImGui::TableSetupDrawChannels(ImGuiTable* table)
{
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClip) ? 1 : table->ColumnsEnabledCount;
    const int channels_for_bg = 1 + 1 * freeze_row_multiplier;
    const int channels_for_dummy = (table->ColumnsEnabledCount < table->ColumnsCount || table->VisibleMaskByIndex != table->EnabledMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_bg + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = (ImGuiTableDrawChannelIdx)((channels_for_dummy > 0) ? channels_total - 1 : -1);
    table->Bg2DrawChannelCurrent = TABLE_DRAW_CHANNEL_BG2_FROZEN;
    table->Bg2DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)((table->FreezeRowsCount > 0) ? 2 + channels_for_row : TABLE_DRAW_CHANNEL_BG2_FROZEN);

    int draw_channel_current = 2;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->IsVisibleX && column->IsVisibleY)
        {
            column->DrawChannelFrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current);
            column->DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row + 1 : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClip))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelFrozen = column->DrawChannelUnfrozen = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelFrozen;
    }

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // All our cell highlight are manually clipped with BgClipRect. When unfreezing it will be made smaller to fit scrolling rect.
    // (This technically isn't part of setting up draw channels, but is reasonably related to be done here)
    table->BgClipRect = table->InnerClipRect;
    table->Bg0ClipRectForDrawCmd = table->OuterWindow->ClipRect;
    table->Bg2ClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);
}